

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O1

bool __thiscall dielectric::scatter(dielectric *this,ray *r_in,hit_record *rec,scatter_record *srec)

{
  double dVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  (srec->attenuation).e[0] = 1.0;
  (srec->attenuation).e[1] = 1.0;
  (srec->attenuation).e[2] = 1.0;
  (srec->pdf_ptr).super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  this_00 = (srec->pdf_ptr).super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (srec->pdf_ptr).super___shared_ptr<pdf,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  srec->skip_pdf = true;
  dVar3 = this->refraction_index;
  if (rec->front_face != false) {
    dVar3 = 1.0 / dVar3;
  }
  dVar4 = (r_in->dir).e[0];
  dVar7 = (r_in->dir).e[1];
  dVar6 = (r_in->dir).e[2];
  dVar4 = dVar6 * dVar6 + dVar4 * dVar4 + dVar7 * dVar7;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  dVar4 = 1.0 / dVar4;
  dVar8 = (r_in->dir).e[0] * dVar4;
  dVar9 = (r_in->dir).e[1] * dVar4;
  dVar4 = dVar4 * (r_in->dir).e[2];
  dVar7 = (double)((ulong)dVar8 ^ (ulong)DAT_00119100);
  dVar6 = ((rec->normal).e[0] * dVar7 - (rec->normal).e[1] * dVar9) - (rec->normal).e[2] * dVar4;
  if (1.0 <= dVar6) {
    dVar6 = 1.0;
  }
  dVar5 = 1.0 - dVar6 * dVar6;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  if (dVar5 * dVar3 <= 1.0) {
    dVar5 = (1.0 - dVar3) / (dVar3 + 1.0);
    dVar5 = dVar5 * dVar5;
    dVar6 = pow(1.0 - dVar6,5.0);
    iVar2 = rand();
    if (dVar6 * (1.0 - dVar5) + dVar5 <= (double)iVar2 * 4.656612873077393e-10) {
      dVar6 = (rec->normal).e[0];
      dVar5 = (rec->normal).e[1];
      dVar1 = (rec->normal).e[2];
      dVar7 = -dVar4 * dVar1 + dVar7 * dVar6 + -dVar9 * dVar5;
      if (1.0 <= dVar7) {
        dVar7 = 1.0;
      }
      dVar8 = (dVar8 + dVar6 * dVar7) * dVar3;
      dVar9 = (dVar5 * dVar7 + dVar9) * dVar3;
      dVar3 = (dVar7 * dVar1 + dVar4) * dVar3;
      dVar4 = ABS(1.0 - (dVar3 * dVar3 + dVar8 * dVar8 + dVar9 * dVar9));
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
      dVar8 = dVar8 - (rec->normal).e[0] * dVar4;
      dVar9 = dVar9 - (rec->normal).e[1] * dVar4;
      dVar4 = dVar3 - dVar4 * (rec->normal).e[2];
      goto LAB_001173e7;
    }
  }
  dVar3 = (rec->normal).e[0];
  dVar7 = (rec->normal).e[1];
  dVar6 = (rec->normal).e[2];
  dVar5 = dVar4 * dVar6 + dVar8 * dVar3 + dVar9 * dVar7;
  dVar5 = dVar5 + dVar5;
  dVar8 = dVar8 - dVar3 * dVar5;
  dVar9 = dVar9 - dVar7 * dVar5;
  dVar4 = dVar4 - dVar5 * dVar6;
LAB_001173e7:
  dVar3 = r_in->tm;
  dVar7 = (rec->p).e[0];
  dVar6 = (rec->p).e[1];
  (srec->skip_pdf_ray).orig.e[2] = (rec->p).e[2];
  (srec->skip_pdf_ray).orig.e[0] = dVar7;
  (srec->skip_pdf_ray).orig.e[1] = dVar6;
  (srec->skip_pdf_ray).dir.e[0] = dVar8;
  (srec->skip_pdf_ray).dir.e[1] = dVar9;
  (srec->skip_pdf_ray).dir.e[2] = dVar4;
  (srec->skip_pdf_ray).tm = dVar3;
  return true;
}

Assistant:

bool scatter(const ray& r_in, const hit_record& rec, scatter_record& srec) const override {
        srec.attenuation = color(1.0, 1.0, 1.0);
        srec.pdf_ptr = nullptr;
        srec.skip_pdf = true;
        double ri = rec.front_face ? (1.0/refraction_index) : refraction_index;

        vec3 unit_direction = unit_vector(r_in.direction());
        double cos_theta = std::fmin(dot(-unit_direction, rec.normal), 1.0);
        double sin_theta = std::sqrt(1.0 - cos_theta*cos_theta);

        bool cannot_refract = ri * sin_theta > 1.0;
        vec3 direction;

        if (cannot_refract || reflectance(cos_theta, ri) > random_double())
            direction = reflect(unit_direction, rec.normal);
        else
            direction = refract(unit_direction, rec.normal, ri);

        srec.skip_pdf_ray = ray(rec.p, direction, r_in.time());
        return true;
    }